

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double plate_scale;
  bool bVar1;
  int iVar2;
  path *this;
  directory_iterator local_1e8;
  path ext;
  directory_iterator __end1;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_190;
  path local_180;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_148;
  string platp;
  string output_path;
  string backgr_path;
  string plates_path;
  string local_b8;
  string local_98;
  string local_78;
  path local_58;
  
  if (argc < 6) {
    std::operator<<((ostream *)&std::cout,
                    "Usage: datset /path/to/plates/ /path/to/background/ ./output_path output_image_size scale_factor number_of_warps\n"
                   );
    iVar2 = -1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&plates_path,argv[1],(allocator<char> *)&ext);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&backgr_path,argv[2],(allocator<char> *)&ext);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output_path,argv[3],(allocator<char> *)&ext);
    iVar2 = atoi(argv[4]);
    plate_scale = atof(argv[5]);
    platp._M_dataplus._M_p = (pointer)&platp.field_2;
    platp._M_string_length = 0;
    platp.field_2._M_local_buf[0] = '\0';
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&ext,&plates_path,auto_format);
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)&local_190,&ext);
    std::filesystem::__cxx11::path::~path(&ext);
    std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_158,&local_190);
    local_1e8._M_dir._M_ptr = local_158._M_ptr;
    local_1e8._M_dir._M_refcount._M_pi = local_158._M_refcount._M_pi;
    local_158._M_ptr = (element_type *)0x0;
    local_158._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
    std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_148,&local_190);
    __end1._M_dir._M_ptr = (element_type *)0x0;
    __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
    while (local_1e8._M_dir._M_refcount._M_pi != __end1._M_dir._M_refcount._M_pi) {
      this = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_1e8);
      std::filesystem::__cxx11::path::filename(&local_180,this);
      std::filesystem::__cxx11::path::extension(&ext,&local_180);
      std::filesystem::__cxx11::path::~path(&local_180);
      std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                (&local_180,(char (*) [5])".jpg",auto_format);
      bVar1 = std::filesystem::__cxx11::operator==(&ext,&local_180);
      if (bVar1) {
        std::filesystem::__cxx11::path::~path(&local_180);
LAB_001075f0:
        std::__cxx11::string::string((string *)&local_180,(string *)this);
        std::__cxx11::string::operator=((string *)&platp,(string *)&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string((string *)&local_b8,(string *)&platp);
        std::__cxx11::string::string((string *)&local_78,(string *)&backgr_path);
        std::__cxx11::string::string((string *)&local_98,(string *)&output_path);
        generateDatasetImages(&local_b8,&local_78,&local_98,iVar2,plate_scale,5);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_b8);
      }
      else {
        std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                  (&local_58,(char (*) [5])".png",auto_format);
        bVar1 = std::filesystem::__cxx11::operator==(&ext,&local_58);
        std::filesystem::__cxx11::path::~path(&local_58);
        std::filesystem::__cxx11::path::~path(&local_180);
        if (bVar1) goto LAB_001075f0;
      }
      std::filesystem::__cxx11::path::~path(&ext);
      std::filesystem::__cxx11::directory_iterator::operator++(&local_1e8);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_dir._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
    std::__cxx11::string::~string((string *)&platp);
    std::__cxx11::string::~string((string *)&output_path);
    std::__cxx11::string::~string((string *)&backgr_path);
    std::__cxx11::string::~string((string *)&plates_path);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char const *argv[]) {
    if (argc<6) {
        cout<<"Usage: datset /path/to/plates/ /path/to/background/ ./output_path output_image_size scale_factor number_of_warps\n";
        return -1;
    }

    string plates_path = string(argv[1]);
    string backgr_path = string(argv[2]);
    string output_path = string(argv[3]);
    int image_size = atoi(argv[4]);
    double plate_scale = atof(argv[5]);

    string platp;
    for (const auto & entry : filesystem::directory_iterator(plates_path)) {
        auto ext = entry.path().filename().extension();
        if (ext == ".jpg" || ext ==".png") { 
            platp = entry.path();
            generateDatasetImages(platp, backgr_path, output_path,  image_size, plate_scale, 5);
        }
    } 
    return 0;
}